

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

Stmt * __thiscall kratos::Stmt::pre_stmt(Stmt *this)

{
  IRNodeKind IVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  uint64_t uVar5;
  undefined1 local_60 [40];
  uint64_t index;
  undefined8 local_28;
  shared_ptr<kratos::StmtBlock> *block;
  Stmt *stmt_parent;
  Stmt *this_local;
  ulong uVar4;
  
  if ((this->parent_ == (IRNode *)0x0) ||
     (stmt_parent = this, IVar1 = IRNode::ir_node_kind(this->parent_), IVar1 != StmtKind)) {
    return (Stmt *)0x0;
  }
  block = (shared_ptr<kratos::StmtBlock> *)this->parent_;
  if (*(int *)&(((IRNode *)((long)block + 0x68))->fn_name_ln).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish != 4) {
    return (Stmt *)0x0;
  }
  as<kratos::StmtBlock>((Stmt *)&index);
  local_28 = (Stmt *)&index;
  peVar3 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&index);
  iVar2 = (*(peVar3->super_Stmt).super_IRNode._vptr_IRNode[3])(peVar3,this);
  uVar4 = CONCAT44(extraout_var,iVar2);
  local_60._32_8_ = uVar4;
  if (uVar4 != 0) {
    peVar3 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    uVar5 = StmtBlock::size(peVar3);
    if (uVar4 < uVar5) {
      peVar3 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_28);
      StmtBlock::operator[]((StmtBlock *)local_60,(uint32_t)peVar3);
      this_local = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)local_60);
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_60);
      goto LAB_002974d7;
    }
  }
  this_local = (Stmt *)0x0;
LAB_002974d7:
  std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)&index);
  return this_local;
}

Assistant:

Stmt *Stmt::pre_stmt() const {
    if (!parent_ || parent_->ir_node_kind() != IRNodeKind::StmtKind) return nullptr;
    auto *stmt_parent = reinterpret_cast<Stmt *>(parent_);
    if (stmt_parent->type_ != StatementType::Block) return nullptr;
    auto const &block = stmt_parent->as<StmtBlock>();
    auto index = block->index_of(this);
    if (index != 0 && index < block->size()) {
        return (*block)[index - 1].get();
    }
    return nullptr;
}